

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::LineBufferTaskIIF::getWritePointer<half>
          (LineBufferTaskIIF *this,int y,unsigned_short **outWritePointerRight,
          size_t *outPixelsToCopySSE,size_t *outPixelsToCopyNormal,int channelBank)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  ulong *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  size_t pixelsToCopy;
  size_t shortsToCopy;
  size_t bytesToCopy;
  int dMaxX1;
  int dMinX1;
  char *linePtr1;
  sliceOptimizationData *firstSlice;
  size_t firstChannel;
  int sizeOfSingleValue;
  size_t nbSlicesInBank;
  size_type local_48;
  ulong local_38;
  
  local_38 = std::
             vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
             ::size((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     *)(*(long *)(in_RDI + 0x10) + 0x150));
  sVar6 = std::
          vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                  *)(*(long *)(in_RDI + 0x10) + 0x150));
  if (4 < sVar6) {
    local_38 = local_38 >> 1;
  }
  local_48 = 0;
  if (in_R9D == 1) {
    sVar6 = std::
            vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
            ::size((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                    *)(*(long *)(in_RDI + 0x10) + 0x150));
    local_48 = sVar6 >> 1;
  }
  pvVar7 = std::
           vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           ::operator[]((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                         *)(*(long *)(in_RDI + 0x10) + 0x150),local_48);
  iVar3 = Imath_2_5::modp((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (iVar3 != 0) {
    *in_RCX = 0;
    *in_R8 = 0;
    *in_RDX = 0;
  }
  pcVar1 = pvVar7->base;
  iVar3 = Imath_2_5::divp(in_ESI,pvVar7->ySampling);
  sVar2 = pvVar7->yStride;
  iVar4 = Imath_2_5::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0x9c),pvVar7->xSampling);
  iVar5 = Imath_2_5::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0xa0),pvVar7->xSampling);
  *in_RDX = pcVar1 + (long)iVar4 * pvVar7->xStride + (long)iVar3 * sVar2;
  uVar8 = ((((long)iVar5 * pvVar7->xStride - (long)iVar4 * pvVar7->xStride) + 2) / 2) / local_38 + 1
  ;
  *in_RCX = uVar8 >> 3;
  *in_R8 = uVar8 & 7;
  return;
}

Assistant:

void LineBufferTaskIIF::getWritePointer 
                            (int y,
                             unsigned short*& outWritePointerRight,
                             size_t& outPixelsToCopySSE,
                             size_t& outPixelsToCopyNormal,
                             int channelBank
                            ) const
{
      // Channels are saved alphabetically, so the order is B G R.
      // The last slice (R) will give us the location of our write pointer.
      // The only slice that we support skipping is alpha, i.e. the first one.  
      // This does not impact the write pointer or the pixels to copy at all.
      
      size_t nbSlicesInBank = _ifd->optimizationData.size();
      
      int sizeOfSingleValue = sizeof(TYPE);
      
      if(_ifd->optimizationData.size()>4)
      {
          // there are two banks - we only copy one at once
          nbSlicesInBank/=2;
      }

      
      size_t firstChannel = 0;
      if(channelBank==1)
      {
          firstChannel = _ifd->optimizationData.size()/2;
      }
      
       sliceOptimizationData& firstSlice = _ifd->optimizationData[firstChannel];
      
      if (modp (y, firstSlice.ySampling) != 0)
      {
          outPixelsToCopySSE    = 0;
          outPixelsToCopyNormal = 0;
          outWritePointerRight  = 0;
      }
      
      const char* linePtr1  = firstSlice.base +
      divp (y, firstSlice.ySampling) *
      firstSlice.yStride;
      
      int dMinX1 = divp (_ifd->minX, firstSlice.xSampling);
      int dMaxX1 = divp (_ifd->maxX, firstSlice.xSampling);
      
      // Construct the writePtr so that we start writing at
      // linePtr + Min offset in the line.
      outWritePointerRight =  (unsigned short*)(linePtr1 +
      dMinX1 * firstSlice.xStride );
      
      size_t bytesToCopy  = ((linePtr1 + dMaxX1 * firstSlice.xStride ) -
      (linePtr1 + dMinX1 * firstSlice.xStride )) + 2;
      size_t shortsToCopy = bytesToCopy / sizeOfSingleValue;
      size_t pixelsToCopy = (shortsToCopy / nbSlicesInBank ) + 1;
      
      // We only support writing to SSE if we have no pixels to copy normally
      outPixelsToCopySSE    = pixelsToCopy / 8;
      outPixelsToCopyNormal = pixelsToCopy % 8;
      
}